

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,FileDescriptor *descriptor,
          bool immutable,bool kotlin)

{
  ulong uVar1;
  string local_58;
  undefined1 local_23;
  byte local_22;
  byte local_21;
  bool kotlin_local;
  FileDescriptor *pFStack_20;
  bool immutable_local;
  FileDescriptor *descriptor_local;
  ClassNameResolver *this_local;
  string *result;
  
  local_23 = 0;
  local_22 = kotlin;
  local_21 = immutable;
  pFStack_20 = descriptor;
  descriptor_local = (FileDescriptor *)this;
  this_local = (ClassNameResolver *)__return_storage_ptr__;
  FileJavaPackage_abi_cxx11_
            (__return_storage_ptr__,(java *)descriptor,(FileDescriptor *)(ulong)immutable,immutable)
  ;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'.');
  }
  GetFileClassName_abi_cxx11_(&local_58,this,pFStack_20,(bool)(local_21 & 1),(bool)(local_22 & 1));
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetClassName(const FileDescriptor* descriptor,
                                            bool immutable, bool kotlin) {
  std::string result = FileJavaPackage(descriptor, immutable);
  if (!result.empty()) result += '.';
  result += GetFileClassName(descriptor, immutable, kotlin);
  return result;
}